

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall dg::debug::DG2Dot<dg::LLVMNode>::reopen(DG2Dot<dg::LLVMNode> *this,char *new_file)

{
  ulong uVar1;
  char *in_RSI;
  long in_RDI;
  char *local_10;
  
  local_10 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_10 = "/dev/stdout";
  }
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) != 0) {
    std::ofstream::close();
  }
  std::ofstream::open(in_RDI + 0xd0,local_10,0x10);
  *(char **)(in_RDI + 0x98) = local_10;
  return;
}

Assistant:

void reopen(const char *new_file) {
        if (!new_file)
            new_file = "/dev/stdout";

        if (out.is_open())
            out.close();

        out.open(new_file);
        file = new_file;
    }